

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdExpandCollectAnd_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  int iVar1;
  uint uVar2;
  Kit_DsdObj_t KVar3;
  Kit_DsdObj_t *pKVar4;
  ulong uVar5;
  
  iVar1 = Abc_Lit2Var(iLit);
  pKVar4 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = Abc_LitIsCompl(iLit);
  if (((iVar1 == 0) && (uVar2 = Abc_Lit2Var(iLit), p->nVars <= uVar2)) &&
     (KVar3 = *pKVar4, ((uint)KVar3 & 0x1c0) == 0xc0)) {
    for (uVar5 = 0; uVar5 < (uint)KVar3 >> 0x1a; uVar5 = uVar5 + 1) {
      Kit_DsdExpandCollectAnd_rec
                (p,(uint)*(ushort *)(&pKVar4[1].field_0x0 + uVar5 * 2),piLitsNew,nLitsNew);
      KVar3 = *pKVar4;
    }
    return;
  }
  iVar1 = *nLitsNew;
  *nLitsNew = iVar1 + 1;
  piLitsNew[iVar1] = iLit;
  return;
}

Assistant:

void Kit_DsdExpandCollectAnd_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_LitIsCompl(iLit) || Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_AND )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectAnd_rec( p, iLitFanin, piLitsNew, nLitsNew );
}